

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_update_stat_right(void)

{
  osgen_txtwin_t *win;
  int iVar1;
  size_t sVar2;
  int iVar3;
  ulong __n;
  int iVar4;
  char buf [64];
  char acStack_78 [72];
  
  win = S_status_win;
  if (S_stat_reset_free != (char *)0x0 && S_status_win != (osgen_txtwin_t *)0x0) {
    S_status_win->txtfree = S_stat_reset_free;
    iVar1 = S_stat_reset_x;
    (win->base).x = S_stat_reset_x;
    iVar3 = (int)(win->base).wid;
    iVar4 = iVar3 - iVar1;
    if (iVar1 <= iVar3) {
      sVar2 = strlen(S_scorebuf);
      iVar3 = (int)sVar2 + 1;
      if (iVar3 < iVar4) {
        do {
          __n = ~sVar2 + (long)iVar4;
          if (0x3e < __n) {
            __n = 0x3f;
          }
          memset(acStack_78,0x20,__n);
          ossaddsb(win,acStack_78,__n,1);
          iVar4 = iVar4 - (int)__n;
        } while (iVar3 < iVar4);
      }
      else {
        ossaddsb(win," ",1,1);
      }
      sVar2 = strlen(S_scorebuf);
      ossaddsb(win,S_scorebuf,sVar2,1);
      return;
    }
  }
  return;
}

Assistant:

static void osgen_update_stat_right()
{
    osgen_txtwin_t *win;
    int wid_rem;
    size_t char_len;
    
    /* 
     *   if there's no statusline window, or no reset point, we can't do
     *   anything right now 
     */
    if ((win = S_status_win) == 0 || S_stat_reset_free == 0)
        return;

    /* 
     *   set the statusline position back to where it was when we finished
     *   with the statusline itself
     */
    win->txtfree = S_stat_reset_free;
    win->base.x = S_stat_reset_x;

    /* if there's no space, don't draw anything */
    if (win->base.x > (int)win->base.wid)
        return;

    /* figure out how much space in the window we have */
    wid_rem = win->base.wid - win->base.x;

    /* figure out how much we're adding */
    char_len = strlen(S_scorebuf);

    /* 
     *   if we're adding more than we have room for, add a space and then
     *   add the buffer contents 
     */
    if ((int)char_len + 1 >= wid_rem)
    {
        /* add a space */
        ossaddsb(win, " ", 1, TRUE);

        /* add the right-half string */
        ossaddsb(win, S_scorebuf, strlen(S_scorebuf), TRUE);
    }
    else
    {
        /* add spaces to right-align the scorebuf text */
        while (wid_rem > (int)char_len + 1)
        {
            char buf[64];
            size_t cur;
            
            /* add the remaining spaces, up to a buffer-full */
            cur = wid_rem - char_len - 1;
            if (cur > sizeof(buf) - 1)
                cur = sizeof(buf) - 1;

            /* make a buffer-full of spaces */
            memset(buf, ' ', cur);

            /* display it */
            ossaddsb(win, buf, cur, TRUE);

            /* deduct the amount we displayed from the width remaining */
            wid_rem -= cur;
        }

        /* add the right-half string */
        ossaddsb(win, S_scorebuf, strlen(S_scorebuf), TRUE);
    }
}